

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2boolean_operation.cc
# Opt level: O2

void __thiscall
S2BooleanOperation::Impl::CrossingProcessor::DoneBoundaryPair(CrossingProcessor *this)

{
  pointer *pppVar1;
  pointer ppVar2;
  InputEdgeCrossings *pIVar3;
  pointer ppVar4;
  pair<int,_(anonymous_namespace)::CrossingInputEdge> *ppVar5;
  pair<int,_(anonymous_namespace)::CrossingInputEdge> *ppVar6;
  mapped_type *pmVar7;
  pointer ppVar8;
  pointer ppVar9;
  ulong uVar10;
  pointer ppVar11;
  long lVar12;
  ulong uVar13;
  pair<int,_(anonymous_namespace)::CrossingInputEdge> *ppVar14;
  long lVar15;
  pair<int,_(anonymous_namespace)::CrossingInputEdge> pVar16;
  pair<S2BooleanOperation::SourceId,_bool> *key;
  btree<gtl::internal_btree::map_params<S2BooleanOperation::SourceId,_int,_std::less<S2BooleanOperation::SourceId>,_std::allocator<std::pair<const_S2BooleanOperation::SourceId,_int>_>,_256,_false>_>
  *this_00;
  _Vector_base<std::pair<int,_(anonymous_namespace)::CrossingInputEdge>,_std::allocator<std::pair<int,_(anonymous_namespace)::CrossingInputEdge>_>_>
  *p_Var17;
  pointer ppVar18;
  iterator iVar19;
  btree_iterator<gtl::internal_btree::btree_node<gtl::internal_btree::map_params<S2BooleanOperation::SourceId,_int,_std::less<S2BooleanOperation::SourceId>,_std::allocator<std::pair<const_S2BooleanOperation::SourceId,_int>_>,_256,_false>_>,_std::pair<const_S2BooleanOperation::SourceId,_int>_&,_std::pair<const_S2BooleanOperation::SourceId,_int>_*>
  local_70;
  pointer local_60;
  CrossingProcessor *local_58;
  btree<gtl::internal_btree::map_params<S2BooleanOperation::SourceId,_int,_std::less<S2BooleanOperation::SourceId>,_std::allocator<std::pair<const_S2BooleanOperation::SourceId,_int>_>,_256,_false>_>
  *local_50;
  pointer local_48;
  S2LogMessage local_40;
  
  this_00 = (btree<gtl::internal_btree::map_params<S2BooleanOperation::SourceId,_int,_std::less<S2BooleanOperation::SourceId>,_std::allocator<std::pair<const_S2BooleanOperation::SourceId,_int>_>,_256,_false>_>
             *)&this->source_id_map_;
  local_70.node =
       (btree_node<gtl::internal_btree::map_params<S2BooleanOperation::SourceId,_int,_std::less<S2BooleanOperation::SourceId>,_std::allocator<std::pair<const_S2BooleanOperation::SourceId,_int>_>,_256,_false>_>
        *)0xffffffff00000000;
  pmVar7 = gtl::internal_btree::
           btree_map_container<gtl::internal_btree::btree<gtl::internal_btree::map_params<S2BooleanOperation::SourceId,_int,_std::less<S2BooleanOperation::SourceId>,_std::allocator<std::pair<const_S2BooleanOperation::SourceId,_int>_>,_256,_false>_>_>
           ::operator[]((btree_map_container<gtl::internal_btree::btree<gtl::internal_btree::map_params<S2BooleanOperation::SourceId,_int,_std::less<S2BooleanOperation::SourceId>,_std::allocator<std::pair<const_S2BooleanOperation::SourceId,_int>_>,_256,_false>_>_>
                         *)this_00,(key_type *)&local_70);
  *pmVar7 = -1;
  local_70.node =
       (btree_node<gtl::internal_btree::map_params<S2BooleanOperation::SourceId,_int,_std::less<S2BooleanOperation::SourceId>,_std::allocator<std::pair<const_S2BooleanOperation::SourceId,_int>_>,_256,_false>_>
        *)0xfffffffe00000000;
  pmVar7 = gtl::internal_btree::
           btree_map_container<gtl::internal_btree::btree<gtl::internal_btree::map_params<S2BooleanOperation::SourceId,_int,_std::less<S2BooleanOperation::SourceId>,_std::allocator<std::pair<const_S2BooleanOperation::SourceId,_int>_>,_256,_false>_>_>
           ::operator[]((btree_map_container<gtl::internal_btree::btree<gtl::internal_btree::map_params<S2BooleanOperation::SourceId,_int,_std::less<S2BooleanOperation::SourceId>,_std::allocator<std::pair<const_S2BooleanOperation::SourceId,_int>_>,_256,_false>_>_>
                         *)this_00,(key_type *)&local_70);
  *pmVar7 = -2;
  local_70.node =
       (btree_node<gtl::internal_btree::map_params<S2BooleanOperation::SourceId,_int,_std::less<S2BooleanOperation::SourceId>,_std::allocator<std::pair<const_S2BooleanOperation::SourceId,_int>_>,_256,_false>_>
        *)0xfffffffd00000000;
  pmVar7 = gtl::internal_btree::
           btree_map_container<gtl::internal_btree::btree<gtl::internal_btree::map_params<S2BooleanOperation::SourceId,_int,_std::less<S2BooleanOperation::SourceId>,_std::allocator<std::pair<const_S2BooleanOperation::SourceId,_int>_>,_256,_false>_>_>
           ::operator[]((btree_map_container<gtl::internal_btree::btree<gtl::internal_btree::map_params<S2BooleanOperation::SourceId,_int,_std::less<S2BooleanOperation::SourceId>,_std::allocator<std::pair<const_S2BooleanOperation::SourceId,_int>_>,_256,_false>_>_>
                         *)this_00,(key_type *)&local_70);
  *pmVar7 = -3;
  pIVar3 = this->input_crossings_;
  ppVar18 = (this->source_edge_crossings_).
            super__Vector_base<std::pair<int,_std::pair<S2BooleanOperation::SourceId,_bool>_>,_std::allocator<std::pair<int,_std::pair<S2BooleanOperation::SourceId,_bool>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  ppVar4 = (pIVar3->
           super__Vector_base<std::pair<int,_(anonymous_namespace)::CrossingInputEdge>,_std::allocator<std::pair<int,_(anonymous_namespace)::CrossingInputEdge>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  lVar15 = (long)(pIVar3->
                 super__Vector_base<std::pair<int,_(anonymous_namespace)::CrossingInputEdge>,_std::allocator<std::pair<int,_(anonymous_namespace)::CrossingInputEdge>_>_>
                 )._M_impl.super__Vector_impl_data._M_finish - (long)ppVar4;
  local_60 = (this->source_edge_crossings_).
             super__Vector_base<std::pair<int,_std::pair<S2BooleanOperation::SourceId,_bool>_>,_std::allocator<std::pair<int,_std::pair<S2BooleanOperation::SourceId,_bool>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
  p_Var17 = (_Vector_base<std::pair<int,_(anonymous_namespace)::CrossingInputEdge>,_std::allocator<std::pair<int,_(anonymous_namespace)::CrossingInputEdge>_>_>
             *)(((long)local_60 - (long)ppVar18 >> 4) + (lVar15 >> 3));
  if ((ulong)p_Var17 >> 0x3c != 0) {
    std::__throw_length_error("vector::reserve");
  }
  local_58 = this;
  local_50 = this_00;
  if ((_Vector_base<std::pair<int,_(anonymous_namespace)::CrossingInputEdge>,_std::allocator<std::pair<int,_(anonymous_namespace)::CrossingInputEdge>_>_>
       *)((long)(pIVar3->
                super__Vector_base<std::pair<int,_(anonymous_namespace)::CrossingInputEdge>,_std::allocator<std::pair<int,_(anonymous_namespace)::CrossingInputEdge>_>_>
                )._M_impl.super__Vector_impl_data._M_end_of_storage - (long)ppVar4 >> 3) < p_Var17)
  {
    ppVar8 = std::
             _Vector_base<std::pair<int,_(anonymous_namespace)::CrossingInputEdge>,_std::allocator<std::pair<int,_(anonymous_namespace)::CrossingInputEdge>_>_>
             ::_M_allocate(p_Var17,(size_t)ppVar18);
    ppVar4 = (pIVar3->
             super__Vector_base<std::pair<int,_(anonymous_namespace)::CrossingInputEdge>,_std::allocator<std::pair<int,_(anonymous_namespace)::CrossingInputEdge>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    ppVar11 = (pIVar3->
              super__Vector_base<std::pair<int,_(anonymous_namespace)::CrossingInputEdge>,_std::allocator<std::pair<int,_(anonymous_namespace)::CrossingInputEdge>_>_>
              )._M_impl.super__Vector_impl_data._M_finish;
    for (lVar12 = 0; ppVar2 = (pointer)((long)&ppVar4->first + lVar12), ppVar2 != ppVar11;
        lVar12 = lVar12 + 8) {
      *(pair<int,_(anonymous_namespace)::CrossingInputEdge> *)((long)&ppVar8->first + lVar12) =
           *ppVar2;
    }
    if (ppVar4 != (pointer)0x0) {
      operator_delete(ppVar4);
    }
    (pIVar3->
    super__Vector_base<std::pair<int,_(anonymous_namespace)::CrossingInputEdge>,_std::allocator<std::pair<int,_(anonymous_namespace)::CrossingInputEdge>_>_>
    )._M_impl.super__Vector_impl_data._M_start = ppVar8;
    (pIVar3->
    super__Vector_base<std::pair<int,_(anonymous_namespace)::CrossingInputEdge>,_std::allocator<std::pair<int,_(anonymous_namespace)::CrossingInputEdge>_>_>
    )._M_impl.super__Vector_impl_data._M_finish = (pointer)(lVar15 + (long)ppVar8);
    (pIVar3->
    super__Vector_base<std::pair<int,_(anonymous_namespace)::CrossingInputEdge>,_std::allocator<std::pair<int,_(anonymous_namespace)::CrossingInputEdge>_>_>
    )._M_impl.super__Vector_impl_data._M_end_of_storage = ppVar8 + (long)p_Var17;
    ppVar18 = (this->source_edge_crossings_).
              super__Vector_base<std::pair<int,_std::pair<S2BooleanOperation::SourceId,_bool>_>,_std::allocator<std::pair<int,_std::pair<S2BooleanOperation::SourceId,_bool>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    local_60 = (this->source_edge_crossings_).
               super__Vector_base<std::pair<int,_std::pair<S2BooleanOperation::SourceId,_bool>_>,_std::allocator<std::pair<int,_std::pair<S2BooleanOperation::SourceId,_bool>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
  }
  while( true ) {
    if (ppVar18 == local_60) {
      ppVar18 = (this->source_edge_crossings_).
                super__Vector_base<std::pair<int,_std::pair<S2BooleanOperation::SourceId,_bool>_>,_std::allocator<std::pair<int,_std::pair<S2BooleanOperation::SourceId,_bool>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      if ((this->source_edge_crossings_).
          super__Vector_base<std::pair<int,_std::pair<S2BooleanOperation::SourceId,_bool>_>,_std::allocator<std::pair<int,_std::pair<S2BooleanOperation::SourceId,_bool>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish != ppVar18) {
        (this->source_edge_crossings_).
        super__Vector_base<std::pair<int,_std::pair<S2BooleanOperation::SourceId,_bool>_>,_std::allocator<std::pair<int,_std::pair<S2BooleanOperation::SourceId,_bool>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = ppVar18;
      }
      gtl::internal_btree::
      btree<gtl::internal_btree::map_params<S2BooleanOperation::SourceId,_int,_std::less<S2BooleanOperation::SourceId>,_std::allocator<std::pair<const_S2BooleanOperation::SourceId,_int>_>,_256,_false>_>
      ::clear(this_00);
      return;
    }
    key = &ppVar18->second;
    iVar19 = gtl::internal_btree::
             btree<gtl::internal_btree::map_params<S2BooleanOperation::SourceId,_int,_std::less<S2BooleanOperation::SourceId>,_std::allocator<std::pair<const_S2BooleanOperation::SourceId,_int>_>,_256,_false>_>
             ::find_unique<S2BooleanOperation::SourceId>(this_00,&key->first);
    local_70.node = iVar19.node;
    local_70.position = iVar19.position;
    iVar19 = gtl::internal_btree::
             btree<gtl::internal_btree::map_params<S2BooleanOperation::SourceId,_int,_std::less<S2BooleanOperation::SourceId>,_std::allocator<std::pair<const_S2BooleanOperation::SourceId,_int>_>,_256,_false>_>
             ::end(this_00);
    if ((local_70.node == iVar19.node) && (local_70.position == iVar19.position)) break;
    pIVar3 = this->input_crossings_;
    ppVar9 = gtl::internal_btree::
             btree_iterator<gtl::internal_btree::btree_node<gtl::internal_btree::map_params<S2BooleanOperation::SourceId,_int,_std::less<S2BooleanOperation::SourceId>,_std::allocator<std::pair<const_S2BooleanOperation::SourceId,_int>_>,_256,_false>_>,_std::pair<const_S2BooleanOperation::SourceId,_int>_&,_std::pair<const_S2BooleanOperation::SourceId,_int>_*>
             ::operator->(&local_70);
    pVar16.second = (CrossingInputEdge)((uint)(ppVar18->second).second + ppVar9->second * 2);
    pVar16.first = ppVar18->first;
    ppVar5 = (pIVar3->
             super__Vector_base<std::pair<int,_(anonymous_namespace)::CrossingInputEdge>,_std::allocator<std::pair<int,_(anonymous_namespace)::CrossingInputEdge>_>_>
             )._M_impl.super__Vector_impl_data._M_finish;
    if (ppVar5 == (pIVar3->
                  super__Vector_base<std::pair<int,_(anonymous_namespace)::CrossingInputEdge>,_std::allocator<std::pair<int,_(anonymous_namespace)::CrossingInputEdge>_>_>
                  )._M_impl.super__Vector_impl_data._M_end_of_storage) {
      ppVar6 = (pIVar3->
               super__Vector_base<std::pair<int,_(anonymous_namespace)::CrossingInputEdge>,_std::allocator<std::pair<int,_(anonymous_namespace)::CrossingInputEdge>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      lVar15 = (long)ppVar5 - (long)ppVar6;
      local_48 = ppVar18;
      if (lVar15 == 0x7ffffffffffffff8) {
        std::__throw_length_error("vector::_M_realloc_insert");
      }
      uVar10 = lVar15 >> 3;
      uVar13 = uVar10;
      if (ppVar5 == ppVar6) {
        uVar13 = 1;
      }
      p_Var17 = (_Vector_base<std::pair<int,_(anonymous_namespace)::CrossingInputEdge>,_std::allocator<std::pair<int,_(anonymous_namespace)::CrossingInputEdge>_>_>
                 *)(uVar13 + uVar10);
      if ((_Vector_base<std::pair<int,_(anonymous_namespace)::CrossingInputEdge>,_std::allocator<std::pair<int,_(anonymous_namespace)::CrossingInputEdge>_>_>
           *)0xffffffffffffffe < p_Var17) {
        p_Var17 = (_Vector_base<std::pair<int,_(anonymous_namespace)::CrossingInputEdge>,_std::allocator<std::pair<int,_(anonymous_namespace)::CrossingInputEdge>_>_>
                   *)0xfffffffffffffff;
      }
      if (CARRY8(uVar13,uVar10)) {
        p_Var17 = (_Vector_base<std::pair<int,_(anonymous_namespace)::CrossingInputEdge>,_std::allocator<std::pair<int,_(anonymous_namespace)::CrossingInputEdge>_>_>
                   *)0xfffffffffffffff;
      }
      ppVar11 = std::
                _Vector_base<std::pair<int,_(anonymous_namespace)::CrossingInputEdge>,_std::allocator<std::pair<int,_(anonymous_namespace)::CrossingInputEdge>_>_>
                ::_M_allocate(p_Var17,(size_t)key);
      this = local_58;
      *(pair<int,_(anonymous_namespace)::CrossingInputEdge> *)((long)ppVar11 + lVar15) = pVar16;
      ppVar4 = ppVar11;
      for (ppVar14 = ppVar6; ppVar14 != ppVar5; ppVar14 = ppVar14 + 1) {
        *ppVar4 = *ppVar14;
        ppVar4 = ppVar4 + 1;
      }
      if (ppVar6 != (pair<int,_(anonymous_namespace)::CrossingInputEdge> *)0x0) {
        operator_delete(ppVar6);
      }
      (pIVar3->
      super__Vector_base<std::pair<int,_(anonymous_namespace)::CrossingInputEdge>,_std::allocator<std::pair<int,_(anonymous_namespace)::CrossingInputEdge>_>_>
      )._M_impl.super__Vector_impl_data._M_start = ppVar11;
      (pIVar3->
      super__Vector_base<std::pair<int,_(anonymous_namespace)::CrossingInputEdge>,_std::allocator<std::pair<int,_(anonymous_namespace)::CrossingInputEdge>_>_>
      )._M_impl.super__Vector_impl_data._M_finish = ppVar4 + 1;
      (pIVar3->
      super__Vector_base<std::pair<int,_(anonymous_namespace)::CrossingInputEdge>,_std::allocator<std::pair<int,_(anonymous_namespace)::CrossingInputEdge>_>_>
      )._M_impl.super__Vector_impl_data._M_end_of_storage = ppVar11 + (long)p_Var17;
      this_00 = local_50;
      ppVar18 = local_48;
    }
    else {
      *ppVar5 = pVar16;
      pppVar1 = &(pIVar3->
                 super__Vector_base<std::pair<int,_(anonymous_namespace)::CrossingInputEdge>,_std::allocator<std::pair<int,_(anonymous_namespace)::CrossingInputEdge>_>_>
                 )._M_impl.super__Vector_impl_data._M_finish;
      *pppVar1 = *pppVar1 + 1;
    }
    ppVar18 = ppVar18 + 1;
  }
  S2LogMessage::S2LogMessage
            (&local_40,
             "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s2boolean_operation.cc"
             ,0x6ad,kFatal,(ostream *)&std::cerr);
  std::operator<<(local_40.stream_,"Check failed: it != source_id_map_.end() ");
  abort();
}

Assistant:

void S2BooleanOperation::Impl::CrossingProcessor::DoneBoundaryPair() {
  // Add entries that translate the "special" crossings.
  source_id_map_[SourceId(kSetInside)] = kSetInside;
  source_id_map_[SourceId(kSetInvertB)] = kSetInvertB;
  source_id_map_[SourceId(kSetReverseA)] = kSetReverseA;
  input_crossings_->reserve(input_crossings_->size() +
                            source_edge_crossings_.size());
  for (const auto& tmp : source_edge_crossings_) {
    auto it = source_id_map_.find(tmp.second.first);
    S2_DCHECK(it != source_id_map_.end());
    input_crossings_->push_back(make_pair(
        tmp.first, CrossingInputEdge(it->second, tmp.second.second)));
  }
  source_edge_crossings_.clear();
  source_id_map_.clear();
}